

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::definePrimitives(Forth *this)

{
  long lVar1;
  
  lVar1 = 0x18;
  do {
    definePrimitive(this,*(char **)((long)&PTR__runtime_error_001424d8 + lVar1),
                    *(Code *)((long)&PTR__AbortException_001424e0 + lVar1),
                    SUB81(*(undefined8 *)((long)&PTR_what_001424e8 + lVar1),0));
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0x25b8);
  return;
}

Assistant:

void definePrimitives() {
			typedef struct {
				const char* name;
				Code code;
				bool immediate;
			} CodeWord;

			CodeWord codeWords[] = {
				// name             code
				// ------------------------------
				{ "NULLPTRWORD", nullptr, true }, // empty difinition (zero index - not found)
				{ "(LIT)", &Forth::doLiteral, false }, //1
				{ "(DOES)", &Forth::setDoes, false }, //2
				{ "EXIT", &Forth::exit, false }, //3 
				{ "(;)", &Forth::endOfDefinition, false }, //4
				{ "(BRANCH)", &Forth::branch, false }, //5
				{ "(ZBRANCH)", &Forth::zbranch, false }, //6
				{ ">R", &Forth::toR, false }, //7
				{ "R>", &Forth::rFrom, false }, //8
				{ "2DROP",&Forth::drop2, false }, //9
				{ "2DUP", &Forth::dup2, false }, //10
				{ "1+", &Forth::plus1, false }, //11
				{ "=", &Forth::equals, false }, //12
				{ "ROT", &Forth::rot, false }, //13
				{ "+", &Forth::plus, false },  //14 CORE
				{ "SWAP", &Forth::swap, false }, //15
				{ "", &Forth::loops_plusloop_check, false }, //16
				{ "NOOP", &Forth::noop, false }, // 17
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
				{ "(FLIT)", &Forth::doFLiteral, false }, // 18
#else
				{ "NOOP", &Forth::noop, false }, // 18
#endif
				{ "TRAVERSE-WORDLIST", &Forth::traversedashwordlist, false }, // 19
				{ "EXECUTE", &Forth::execute, false },  // 20 CORE
				{ "COMPILE,", &Forth::compilecomma, false }, // 21 CORE EXT
				{ "@", &Forth::fetch, false },  // 22 CORE				
				{ "!", &Forth::store, false },  // 23 CORE
				{ "_LOCALTORETURNSTACK", &Forth::localtoreturnstack, false }, // 24 not standard word (for LOCALS)
				{ "_ASSIGNRETURNSTACK", &Forth::assignreturnstack, false }, // 25 not standard word (for LOCALS)
				{ "_PICKRETURNSTACK", &Forth::pickreturnstack, false }, // 26 not standard word (for LOCALS)
				{ ";", &Forth::semicolon, true }, // CORE
				
				{ "*", &Forth::star, false }, // CORE
				{ "-", &Forth::minus, false }, // CORE
				{ ".", &Forth::dot, false },   // CORE
				{ ".R", &Forth::dotR, false },  // CORE EXT
				{ ".RS", &Forth::dotRS, false }, // not standard
				{ ".S", &Forth::dotS, false }, // TOOLS
				{ "/", &Forth::slash, false },  // CORE
				{ "/mod", &Forth::slashMod, false },  // CORE
				{ ":", &Forth::colon, false },  // CORE
				{ ":noname", &Forth::noname, false },  // CORE EXT
				{ "<", &Forth::lessThan, false },  // CORE
				{ ">", &Forth::greaterThan, false },  // CORE
				{ ">BODY", &Forth::toBody, false }, // CORE
				{ ">IN", &Forth::toIn, false }, // CORE

				{ "ABORT", &Forth::abort, false },  // CORE
				{ "ABORT-MESSAGE", &Forth::abortMessage, false },  // not standard
				{ "ACCEPT", &Forth::accept, false },  // CORE
				{ "ALIGN", &Forth::align, false },  // CORE
				{ "ALIGNED", &Forth::aligned, false },  // CORE
				{ "ALLOT", &Forth::allot, false },  // CORE
				{ "AND", &Forth::bitwiseAnd, false },  // CORE
				{ "BASE", &Forth::base, false },  // CORE
				{ "BL", &Forth::bl, false },  // CORE
				{ "BYE", &Forth::bye, false }, // TOOLS EXT
				{ "C!", &Forth::cstore, false }, // CORE
				{ "C@", &Forth::cfetch, false },  // CORE
				{ "CELLS", &Forth::cells, false },  // CORE
				{ "CMOVE", &Forth::cMove, false }, // STRING
				{ "CMOVE>", &Forth::cMoveUp, false }, // STRING
				{ "COMPARE", &Forth::compare, false }, // STRING
				{ "REPLACES", &Forth::replaces, false }, // STRING-EXT
				{ "SUBSTITUTE", &Forth::substitute, false }, // STRING-EXT
				{ "COUNT", &Forth::count, false },  // CORE
				{ "CR", &Forth::cr, false },  // CORE
				{ "CREATE", &Forth::create, false },  // CORE
				{ "DEPTH", &Forth::depth, false },  // CORE
				{ "DOES>", &Forth::does, true },  // CORE
				{ "DROP", &Forth::drop, false },  // CORE
				{ "DUP", &Forth::dup, false }, // CORE
				{ "EMIT", &Forth::emit, false },  // CORE
				{ "EVALUATE", &Forth::evaluate, false },  // CORE
				{ "EVALUATESTART", &Forth::evaluateStart, false },  // not standard word
				{ "EVALUATESTOP", &Forth::evaluateStop, false },  // not standard word
				
				{ "FILL", &Forth::fill, false },  // CORE
				{ "FIND", &Forth::find, false }, // CORE
				{ "HERE", &Forth::here, false }, // CORE
				{ "IMMEDIATE", &Forth::immediate, false }, // CORE // immediate is not immediate command, it can be compiled
				//{ "INTERPRET", &Forth::interpret, false }, // not standard word
				{ "KEY", &Forth::key, false }, // CORE
				{ "KEY?", &Forth::key_question, false }, // FACILITY
				{ "LATEST", &Forth::latest, false }, // not standard word
				{ "LSHIFT", &Forth::lshift, false },  // CORE
				{ "MS", &Forth::ms, false }, // FACILITY EXT
				{ "OR", &Forth::bitwiseOr, false }, // CORE
				{ "PAD", &Forth::pad, false }, // CORE EXT
				{ "PARSE", &Forth::parse, false }, // CORE EXT
				{ "PICK", &Forth::pick, false }, // CORE EXT
				//{ "PROMPT", &Forth::prompt, false }, // not standard word
				{ "QUIT", &Forth::quit, false }, // CORE
				{ "r@", &Forth::rFetch, false }, // CORE
				{ "REFILL", &Forth::refill, false }, // CORE EXT
				{ "ROLL", &Forth::roll, false },  // CORE EXT
				{ "RSHIFT", &Forth::rshift, false },  // CORE
				{ "2/", &Forth::rshiftBy1, false }, // CORE
				{ "SEE", &Forth::see, false }, // TOOLS
				{ "SOURCE", &Forth::source, false }, // CORE
				{ "SOURCE-ID", &Forth::sourcedashid, false }, // CORE
				{ "STATE", &Forth::state, false }, // CORE
				{ "TIME&DATE", &Forth::timeAndDate, false }, // FACILITY EXT
				{ "MS@", &Forth::ms_at, false }, // not standard word - milliseconds since Forth start execution
				{ "TYPE", &Forth::type, false },  // CORE
				{ "u<", &Forth::uLessThan, false },  // CORE
				{ "U>", &Forth::uGreaterThan, false }, // CORE EXT
				{ "U.", &Forth::uDot, false },  // CORE
				{ "UNUSED", &Forth::unused, false }, // CORE EXT
				{ "UTCTIME&DATE", &Forth::utcTimeAndDate, false }, // not standard word
				{ "WORD", &Forth::word, false }, // CORE
				{ "UPPERWORD", &Forth::upperword, false }, // Not standart, used in definition of [IF],[ELSE], [THEN]
				{ "WORDS", &Forth::words, false }, // TOOLS
				{ "XT>NAME", &Forth::xtToName, false }, // not standard word
				{ "XOR", &Forth::bitwiseXor, false }, // CORE
				{ "DO", &Forth::loops_do, true }, // CORE
				{ "?DO", &Forth::loops_question_do, true }, // CORE EXT
				{ "LOOP", &Forth::loops_loop, true },  // CORE
				{ "+loop", &Forth::loops_plusloop, true }, // CORE
				{ "LEAVE", &Forth::loops_leave, true }, // CORE
				{ "I", &Forth::loops_i, false }, // CORE
				{ "J", &Forth::loops_j, false }, // CORE
				{ "K", &Forth::loops_k, false }, // not standard word
				{ "UNLOOP", &Forth::loops_unloop, false }, // CORE
				{ "IF", &Forth::ifthenelse_if, true }, // CORE
				{ "THEN", &Forth::ifthenelse_then, true }, // CORE
				{ "ELSE", &Forth::ifthenelse_else, true }, // CORE
				{ "AHEAD", &Forth::ifthenelse_ahead, true }, // TOOLS EXT
				{ "BEGIN", &Forth::begin_etc_begin, true }, // CORE
				{ "AGAIN", &Forth::begin_etc_again, true }, // CORE
				{ "UNTIL", &Forth::begin_etc_until, true }, // CORE
				{ "WHILE", &Forth::begin_etc_while, true }, // CORE
				{ "REPEAT", &Forth::begin_etc_repeat, true }, // CORE
				{ "[ELSE2]", &Forth::bracketElse, true }, // TOOLS
				{ "S>D", &Forth::StoD, false }, // CORE
				{ "D>S", &Forth::DtoS, false }, // DOUBLE
				{ "M*", &Forth::MultD, false }, // CORE
				{ "UM*", &Forth::MultUD, false }, // CORE
				{ "UM/MOD", &Forth::UMdivideMOD, false }, // CORE
				{ "FM/MOD", &Forth::FMdivideMOD, false }, // CORE
				{ "SM/REM", &Forth::SMdivideREM, false }, // CORE
				{ "<#", &Forth::PicturedInputBufferStart, false }, // CORE
				{ "#", &Forth::PicturedInputBufferHash, false }, // CORE
				{ "#S", &Forth::PicturedInputBufferHashS, false }, // CORE
				{ "HOLD", &Forth::PicturedInputBufferHold, false }, // CORE
				{ "SIGN", &Forth::PicturedInputBufferSign, false }, // CORE
				{ "#>", &Forth::PicturedInputBufferEnd, false }, // CORE
				{ "*/", &Forth::MultDivide, false }, // CORE
				{ "*/MOD", &Forth::MultDivideMod, false }, // CORE
				{ "DNEGATE", &Forth::dnegate, false }, // DOUBLE-NUMBER
				{ "D+", &Forth::dplus, false }, // DOUBLE-NUMBER
				{ "M+", &Forth::mplus, false }, // DOUBLE-NUMBER
				{ "M*/", &Forth::mstarslash, false }, // DOUBLE-NUMBER
				{ "D-", &Forth::dminus, false }, // DOUBLE-NUMBER
				{ "D<", &Forth::dless, false }, // DOUBLE-NUMBER
				{ "DU<", &Forth::duless, false }, // DOUBLE-NUMBER
				{ "D0=", &Forth::dzeroequal, false }, // DOUBLE-NUMBER
				{ "D0<", &Forth::dzeroless, false }, // DOUBLE-NUMBER
				{ "D2*", &Forth::d2star, false }, // DOUBLE-NUMBER
				{ "D2/", &Forth::d2slash, false }, // DOUBLE-NUMBER
				{ "D=",  &Forth::dequal, false }, // DOUBLE-NUMBER
				{ "DMAX",  &Forth::dmax, false }, // DOUBLE-NUMBER
				{ "DMIN",  &Forth::dmin, false }, // DOUBLE-NUMBER
				{ "2ROT",  &Forth::d2rot, false }, // DOUBLE-NUMBER
				{ ">NUMBER", &Forth::toNumber, false }, // CORE
				{ "-TRAILING", &Forth::dashtrailing, false }, // STRINGS
				{ "SEARCH", &Forth::search, false }, // STRINGS
				{ "CATCHBEFORE", &Forth::exceptionsCatchBefore, false }, // not standerd word
				{ "CATCHAFTER", &Forth::exceptionsCatchAfter, false }, // not standerd word
				{ "THROW", &Forth::exceptionsThrow, false }, // EXCEPTION
				{ "HASEXCEPTIONFRAME", &Forth::hasexceptionframe, false }, // not standart (check exception frame for ABORT")
				{ "ENVIRONMENT?", &Forth::environmentquestion, false }, // not standard word
				{ "TRACEON", &Forth::setTraceOn, false }, // not standard word
				{ "TRACEOFF", &Forth::setTraceOff, false }, // not standard word
				{ "CS-PICK", &Forth::csdashpick, false }, // TOOLS
				{ "CS-ROLL", &Forth::csdashroll, false }, // TOOLS
				{ "NR>", &Forth::nrmore, false }, // TOOLS
				{ "N>R", &Forth::nmorer, false }, // TOOLS
				{ "SYNONYM", &Forth::synonym, false }, // TOOLS
				{ "SAVE-INPUT", &Forth::savedashinput, false }, // CORE EXT
				{ "RESTORE-INPUT", &Forth::restoredashinput, false }, // CORE EXT
				{ "MARKERSTART", &Forth::markerstart, false }, // word to implement marker
				{ "MARKERREMOVE", &Forth::markerremove, false }, // word to implement marker
				{ "ALSO", &Forth::also, false }, // SEARCH
				{ "DEFINITIONS", &Forth::searchdefinitions, false }, // SEARCH
				{ "FORTH-WORDLIST", &Forth::forthdashwordlist, false }, // SEARCH
				{ "FORTH", &Forth::searchforth, false }, // SEARCH
				{ "GET-CURRENT", &Forth::getdashcurrent, false }, // SEARCH
				{ "GET-ORDER", &Forth::getdashorder, false }, // SEARCH
				{ "ONLY", &Forth::only, false }, // SEARCH
				{ "ORDER", &Forth::order, false }, // SEARCH
				{ "PREVIOUS", &Forth::previous, false }, // SEARCH
				{ "SET-CURRENT", &Forth::setdashcurrent, false }, // SEARCH
				{ "SET-ORDER", &Forth::setdashorder, false }, // SEARCH
				{ "WORDLIST", &Forth::wordlist, false }, // SEARCH
				{ "SEARCH-WORDLIST", &Forth::searchdashwordlist, false }, // SEARCH
				{ "NAME>STRING", &Forth::namemorestring, false }, // TOOLS  EXT
				{ "NAME>INTERPRET", &Forth::namemoreinterpret, false }, // TOOLS  EXT
				{ "NAME>COMPILE", &Forth::namemorecompile, false }, // TOOLS  EXT
				{ "TRAVERSE-WORDLIST-FINDNEXT", &Forth::traversedashwordlistdashfindnext, false }, // not standard word
				{ "TRAVERSE-WORDLIST-FINDFIRST", &Forth::traversedashwordlistdashfindfirst, false }, // not standard word
				{ "ASSEMBLER", &Forth::assembler, false }, // TOOLS  EXT
				{ "EDITOR", &Forth::editor, false }, // TOOLS  EXT
				{ "NEWPARSEBUFFER", &Forth::newparsebuffer, false }, // not standard word
				{ "BLK", &Forth::blk, false }, // BLOCK
				{ "BLOCK", &Forth::block, false }, // BLOCK
				{ "BUFFER", &Forth::buffer, false }, // BLOCK
				{ "EMPTY-BUFFERS", &Forth::emptydashbuffer, false }, // BLOCK EXT
				{ "FLUSH", &Forth::flush, false }, // BLOCK
				{ "LIST", &Forth::list, false }, // BLOCK EXT
				{ "LOADSTART", &Forth::loadstart, false }, // BLOCK
				{ "SAVE-BUFFERS", &Forth::savedashbuffers, false }, // BLOCK
				{ "SCR", &Forth::scr, false }, // BLOCK EXT
				{ "THRU", &Forth::thru, false }, // BLOCK EXT
				{ "UPDATE", &Forth::update, false }, // BLOCK 
				{ "OPEN-BLOCKS", &Forth::opendashblocks, false }, // not standard word for BLOCK 
				{ "NAME2DATAADDRESS", &Forth::name2dataaddress, false }, // not standard word for LOCALS and TO
				{ "(LOCAL)", &Forth::parlocalpar, false }, // LOCALS
				
				
				
#ifdef FORTHSCRIPTCPP_ENABLE_MEMORY
				{ "RESIZE", &Forth::memResize , false }, //MEMORY
				{ "ALLOCATE", &Forth::memAllocate , false }, // MEMORY
				{ "FREE", &Forth::memFree , false }, // MEMORY
#endif
#ifdef FORTHSCRIPTCPP_ENABLE_FILE
				{ "BIN", &Forth::bin, false },
				{ "CLOSE-FILE", &Forth::closeFile, false },
				{ "CREATE-FILE", &Forth::createFile, false },
				{ "DELETE-FILE", &Forth::deleteFile, false },
				{ "FLUSH-FILE", &Forth::flushFile, false },
				{ "INCLUDE-FILE", &Forth::includeFile, false },
				{ "OPEN-FILE", &Forth::openFile, false },
				{ "R/O", &Forth::readOnly, false },
				{ "R/W", &Forth::readWrite, false },
				{ "READ-CHAR", &Forth::readChar, false },
				{ "READ-FILE", &Forth::readFile, false },
				{ "READ-LINE", &Forth::readLine, false },
				{ "RENAME-FILE", &Forth::renameFile, false },
				{ "W/O", &Forth::writeOnly, false },
				{ "WRITE-CHAR", &Forth::writeChar, false },
				{ "WRITE-FILE", &Forth::writeFile, false },
				{ "WRITE-LINE", &Forth::writeLine, false },
				{ "FILE-POSITION", &Forth::filePosition, false },
				{ "FILE-SIZE", &Forth::fileSize, false },
				{ "REPOSITION-FILE", &Forth::fileReposition, false },
				{ "FILE-STATUS", &Forth::fileStatus, false },
				{ "RESIZE-FILE", &Forth::resizeFile, false },



#endif
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT
				{ "D>F", &Forth::f_dtof, false },
				{ "F>D", &Forth::f_ftod, false },
				{ "FDUP", &Forth::f_dup, false },
				{ "F+", &Forth::f_plus, false },
				{ "FDEPTH", &Forth::f_depth, false },
				{ "F-", &Forth::f_minus, false },
				{ "F/", &Forth::f_slash, false },
				{ "F*", &Forth::f_star, false },
				{ "F0<", &Forth::f_less0, false },
				{ "F0=", &Forth::f_equals0, false },
				{ "FDROP", &Forth::f_drop, false },
				{ "F<", &Forth::f_less, false },
				{ "FALIGN", &Forth::f_align, false },
				{ "FALIGNED", &Forth::f_aligned, false },
				{ "FLOAT+", &Forth::f_floatplus, false },
				{ "FLOATS", &Forth::f_floats, false },
				{ "FLOOR", &Forth::f_floor, false },
				{ "FMAX", &Forth::f_fmax, false },
				{ "FMIN", &Forth::f_fmin, false },
				{ "FROUND", &Forth::f_fround, false },
				{ "FTRUNC", &Forth::f_ftrunc, false },
				{ "FNEGATE", &Forth::f_fnegate, false },
				{ "FROT", &Forth::f_rot, false },
				{ "FPICK", &Forth::f_pick, false },
				{ "FSWAP", &Forth::f_swap, false },
				{ "F!", &Forth::f_store, false }, // FLOAT
				{ "F@", &Forth::f_fetch, false }, // FLOAT
				{ "F~", &Forth::f_ftilda, false },
				{ ">FLOAT", &Forth::toFloat, false },
				{ "REPRESENT", &Forth::represent, false },
#endif
#ifdef FORTHSCRIPTCPP_ENABLE_FLOAT_EXT
				{ "F>S", &Forth::f_fmores, false },
				{ "S>F", &Forth::f_smoref, false },
				{ "FABS", &Forth::f_fabs, false },
				{ "FSIN", &Forth::f_fsin, false },
				{ "FCOS", &Forth::f_fcos, false },
				{ "FTAN", &Forth::f_ftan, false },
				{ "FASIN", &Forth::f_fasin, false },
				{ "FACOS", &Forth::f_facos, false },
				{ "FATAN", &Forth::f_fatan, false },
				{ "FATAN2", &Forth::f_fatan2, false },
				{ "FSINCOS", &Forth::f_fsincos, false },
				{ "FSQRT", &Forth::f_fsqrt, false },
				{ "FEXP", &Forth::f_fexp, false },
				{ "FEXPM1", &Forth::f_fexpm1, false },
				{ "FLN", &Forth::f_fln, false },
				{ "FLOG", &Forth::f_flog, false },
				{ "FLNP1", &Forth::f_flnp1, false },
				{ "F**", &Forth::f_fpower, false },
				{ "FALOG", &Forth::f_falog, false },
				{ "FASINH", &Forth::f_fasinh, false },
				{ "FACOSH", &Forth::f_facosh, false },
				{ "FATANH", &Forth::f_fatanh, false },
				{ "FSINH", &Forth::f_fsinh, false },
				{ "FCOSH", &Forth::f_fcosh, false },
				{ "FTANH", &Forth::f_ftanh, false },
				{ "PRECISION", &Forth::f_precision, false },
				{ "SET-PRECISION", &Forth::f_setprecision, false },
				{ "F.", &Forth::f_fdot, false },
				{ "FS.", &Forth::f_fsdot, false },
				{ "FE.", &Forth::f_fedot, false },
				{ "SF!", &Forth::sf_store, false }, // FLOAT-EXT
				{ "SF@", &Forth::sf_fetch, false }, // FLOAT-EXT
				{ "DF!", &Forth::df_store, false }, // FLOAT-EXT
				{ "DF@", &Forth::df_fetch, false }, // FLOAT-EXT

#endif
				{"FIND-XT-NAME",&Forth::findxtname,false},
				{"FIND-CALLER",&Forth::findcaller,false},
			};

			int numWords = sizeof(codeWords) / sizeof(CodeWord);

			for (int i = 0; i < numWords; i++)
			{
				CodeWord &w = codeWords[i];
				definePrimitive(w.name, w.code,w.immediate);
			}

#ifdef _DEBUG
			if (doLiteralXt != findDefinition(std::string("(lit)"))) 
				throwMessage("Can't find (lit) in kernel dictionary",errorUndefinedWord);
			if (setDoesXt != findDefinition(std::string("(does)")))
				throwMessage("Can't find (does) in kernel dictionary", errorUndefinedWord);
			if (exitXt != findDefinition(std::string("exit")))
				throwMessage("Can't find EXIT in kernel dictionary", errorUndefinedWord);
			if (endOfDefinitionXt != findDefinition(std::string("(;)")))
				throwMessage("Can't find (;) in kernel dictionary", errorUndefinedWord);
#endif
		}